

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::
compile_int_assign(statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
                   *this,typed_lvalue_expression_t *lvalue,typed_expression_t *rvalue)

{
  expression_type_t eVar1;
  iterator iVar2;
  vector<long,_std::allocator<long>_> *pvVar3;
  variable_bounds_visitor_t bounds_visitor;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_compiler;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  lvalue_compiler;
  long local_58;
  undefined **local_50;
  undefined8 local_48;
  undefined **local_40;
  vector<long,_std::allocator<long>_> *local_38;
  undefined **local_30;
  vector<long,_std::allocator<long>_> *local_28;
  
  local_50 = &PTR__typed_expression_visitor_t_00243878;
  local_48 = 0x7fffffff80000000;
  (**(code **)(*(long *)&lvalue->super_typed_expression_t + 0x30))(lvalue);
  local_38 = (this->_bytecode_back_inserter).container;
  local_30 = &PTR__typed_expression_visitor_t_00243758;
  local_40 = &PTR__typed_expression_visitor_t_002436d0;
  local_28 = local_38;
  (**(code **)(*(long *)&lvalue->super_typed_expression_t + 0x30))(lvalue);
  (**(code **)(*(long *)rvalue + 0x30))(rvalue,&local_40);
  local_58 = 2;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_58);
  }
  else {
    *iVar2._M_current = 2;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_58 = (long)(int)local_48;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_58);
  }
  else {
    *iVar2._M_current = local_58;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_58 = (long)local_48._4_4_;
  pvVar3 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_58);
  }
  else {
    *iVar2._M_current = local_58;
    (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  eVar1 = (lvalue->super_typed_expression_t)._type;
  if ((eVar1 == EXPR_TYPE_LOCALINTLVALUE) || (eVar1 == EXPR_TYPE_LOCALINTVAR)) {
    local_58 = 0x1b;
    pvVar3 = (this->_bytecode_back_inserter).container;
    iVar2._M_current =
         (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) goto LAB_001652ee;
    *iVar2._M_current = 0x1b;
  }
  else {
    local_58 = 7;
    pvVar3 = (this->_bytecode_back_inserter).container;
    iVar2._M_current =
         (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar2._M_current ==
        (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
LAB_001652ee:
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>(pvVar3,iVar2,&local_58);
      return;
    }
    *iVar2._M_current = 7;
  }
  (pvVar3->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = iVar2._M_current + 1;
  return;
}

Assistant:

void compile_int_assign(tchecker::typed_lvalue_expression_t const & lvalue, tchecker::typed_expression_t const & rvalue)
  {
    // Get lvalue bounds
    tchecker::details::variable_bounds_visitor_t bounds_visitor;
    lvalue.visit(bounds_visitor);

    // Write bytecode
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> lvalue_compiler(_bytecode_back_inserter);
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_compiler(_bytecode_back_inserter);

    lvalue.visit(lvalue_compiler);
    rvalue.visit(rvalue_compiler);
    _bytecode_back_inserter = tchecker::VM_FAILNOTIN;
    _bytecode_back_inserter = bounds_visitor.min();
    _bytecode_back_inserter = bounds_visitor.max();
    if (lvalue.type() == EXPR_TYPE_LOCALINTLVALUE || lvalue.type() == EXPR_TYPE_LOCALINTVAR)
      _bytecode_back_inserter = tchecker::VM_ASSIGN_FRAME;
    else
      _bytecode_back_inserter = tchecker::VM_ASSIGN;
  }